

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O2

QSize __thiscall
QFusionStyle::sizeFromContents
          (QFusionStyle *this,ContentsType type,QStyleOption *option,QSize *size,QWidget *widget)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Representation RVar6;
  QSize QVar7;
  QStyleOptionButton *pQVar8;
  QStyleOptionMenuItem *pQVar9;
  QComboBox *this_00;
  Representation RVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  double dVar12;
  double dVar13;
  qreal qVar14;
  qreal qVar15;
  qreal qVar16;
  QFontMetricsF fmBold;
  QFontMetricsF fm;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar7 = QCommonStyle::sizeFromContents(&this->super_QCommonStyle,type,option,size,widget);
  uVar11 = (ulong)QVar7 >> 0x20;
  RVar10 = QVar7.ht.m_i;
  RVar6 = QVar7.wd.m_i;
  switch(type) {
  case CT_PushButton:
    pQVar8 = qstyleoption_cast<QStyleOptionButton_const*>(option);
    if (pQVar8 != (QStyleOptionButton *)0x0) {
      iVar4 = (**(code **)(*(long *)&(this->super_QCommonStyle).super_QStyle + 0xe0))
                        (this,0,pQVar8,0);
      uVar5 = iVar4 + RVar6.m_i;
      QVar7.wd.m_i = 0x50;
      QVar7.ht.m_i = 0;
      if (0x50 < (int)uVar5) {
        QVar7.ht.m_i = 0;
        QVar7.wd.m_i = uVar5;
      }
      if ((pQVar8->text).d.size == 0) {
        QVar7.ht.m_i = 0;
        QVar7.wd.m_i = uVar5;
      }
      cVar2 = QIcon::isNull();
      if (cVar2 == '\0') {
        RVar6.m_i = RVar10.m_i - 2;
        if ((pQVar8->iconSize).ht.m_i < 0x11) {
          RVar6.m_i = RVar10.m_i;
        }
        uVar11 = (ulong)(uint)RVar6.m_i;
      }
    }
    break;
  case CT_CheckBox:
  case CT_RadioButton:
    uVar11 = (ulong)(RVar10.m_i + 1);
    break;
  case CT_ToolButton:
    QVar7.wd.m_i = RVar6.m_i + 2;
    QVar7.ht.m_i = 0;
    uVar11 = (ulong)(RVar10.m_i + 2);
    break;
  case CT_ComboBox:
    QVar7.wd.m_i = RVar6.m_i + 2;
    QVar7.ht.m_i = 0;
  case CT_LineEdit:
switchD_00397a41_caseD_e:
    uVar11 = (ulong)(RVar10.m_i + 4);
    break;
  case CT_MenuItem:
    pQVar9 = qstyleoption_cast<QStyleOptionMenuItem_const*>(option);
    if (pQVar9 != (QStyleOptionMenuItem *)0x0) {
      iVar4 = (size->wd).m_i;
      bVar1 = QString::contains(&pQVar9->text,(QChar)0x9,CaseSensitive);
      if (bVar1) {
        iVar4 = iVar4 + pQVar9->reservedShortcutWidth;
      }
      else if (pQVar9->menuItemType == DefaultItem) {
        _fm = &DAT_aaaaaaaaaaaaaaaa;
        QFontMetricsF::QFontMetricsF(&fm,&pQVar9->font);
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        QFont::QFont((QFont *)&local_48,&pQVar9->font);
        QFont::setWeight((Weight)&local_48);
        _fmBold = &DAT_aaaaaaaaaaaaaaaa;
        QFontMetricsF::QFontMetricsF(&fmBold,(QFont *)&local_48);
        iVar3 = (int)&pQVar9->text;
        dVar12 = (double)QFontMetricsF::horizontalAdvance((QString *)&fmBold,iVar3);
        dVar13 = (double)QFontMetricsF::horizontalAdvance((QString *)&fm,iVar3);
        dVar12 = ceil(dVar12 - dVar13);
        iVar4 = iVar4 + (int)dVar12;
        QFontMetricsF::~QFontMetricsF(&fmBold);
        QFont::~QFont((QFont *)&local_48);
        QFontMetricsF::~QFontMetricsF(&fm);
      }
      else if (pQVar9->menuItemType == SubMenu) {
        qVar14 = QStyleHelper::dpiScaled(6.0,option);
        iVar4 = (int)(qVar14 + qVar14 + (double)iVar4);
      }
      qVar14 = QStyleHelper::dpi(option);
      qVar15 = QStyleHelper::dpiScaled(12.0,qVar14);
      iVar3 = (int)qVar15;
      if ((int)qVar15 < pQVar9->maxIconWidth) {
        iVar3 = pQVar9->maxIconWidth;
      }
      qVar15 = QStyleHelper::dpiScaled(25.0,qVar14);
      if (pQVar9->menuItemType == Separator) {
        if ((pQVar9->text).d.size != 0) {
          uVar5 = QFontMetrics::height();
          uVar11 = (ulong)uVar5;
        }
      }
      else {
        cVar2 = QIcon::isNull();
        if ((cVar2 == '\0') &&
           (this_00 = QtPrivate::qobject_cast_helper<QComboBox_const*,QObject_const>
                                (&widget->super_QObject), this_00 != (QComboBox *)0x0)) {
          QVar7 = QComboBox::iconSize(this_00);
          RVar6.m_i = QVar7.ht.m_i.m_i + 2;
          if (RVar6.m_i <= RVar10.m_i) {
            RVar6.m_i = RVar10.m_i;
          }
          uVar11 = (ulong)(uint)RVar6.m_i;
        }
      }
      qVar16 = QStyleHelper::dpiScaled(12.0,qVar14);
      QVar7.wd.m_i = (int)qVar16 + (int)((double)(iVar4 + iVar3 + 2) + qVar15);
      qVar14 = QStyleHelper::dpiScaled(120.0,qVar14);
      QVar7.ht.m_i = 0;
      if (QVar7.wd.m_i <= (int)qVar14) {
        QVar7.ht.m_i = 0;
        QVar7.wd.m_i = (int)qVar14;
      }
    }
    break;
  case CT_MenuBarItem:
    QVar7.wd.m_i = RVar6.m_i + 8;
    QVar7.ht.m_i = 0;
    uVar11 = (ulong)(RVar10.m_i + 5);
    break;
  case CT_SpinBox:
    uVar11 = (ulong)(RVar10.m_i - 3);
    break;
  case CT_SizeGrip:
    QVar7.wd.m_i = RVar6.m_i + 4;
    QVar7.ht.m_i = 0;
    goto switchD_00397a41_caseD_e;
  case CT_GroupBox:
    if (option != (QStyleOption *)0x0) {
      iVar3 = (**(code **)(*(long *)&(this->super_QCommonStyle).super_QStyle + 0xe0))
                        (this,0x26,option,widget);
      iVar4 = QFontMetrics::height();
      if (iVar4 < iVar3) {
        iVar4 = iVar3;
      }
      QVar7.wd.m_i = RVar6.m_i + 10;
      QVar7.ht.m_i = 0;
      uVar11 = (ulong)(RVar10.m_i + iVar4 + 3);
    }
    break;
  case CT_MdiControls:
    QVar7.wd.m_i = RVar6.m_i - 1;
    QVar7.ht.m_i = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSize)((ulong)QVar7 & 0xffffffff | uVar11 << 0x20);
  }
  __stack_chk_fail();
}

Assistant:

QSize QFusionStyle::sizeFromContents(ContentsType type, const QStyleOption *option,
                                     const QSize &size, const QWidget *widget) const
{
    QSize newSize = QCommonStyle::sizeFromContents(type, option, size, widget);
    switch (type) {
    case CT_PushButton:
        if (const QStyleOptionButton *btn = qstyleoption_cast<const QStyleOptionButton *>(option)) {
            const int horizontalMargin = pixelMetric(PM_ButtonMargin, btn);
            newSize += QSize(horizontalMargin, 0);
            if (!btn->text.isEmpty() && newSize.width() < 80)
                newSize.setWidth(80);
            if (!btn->icon.isNull() && btn->iconSize.height() > 16)
                newSize -= QSize(0, 2);
        }
        break;
    case CT_GroupBox:
        if (option) {
            int topMargin = qMax(pixelMetric(PM_IndicatorHeight, option, widget), option->fontMetrics.height()) + groupBoxTopMargin;
            newSize += QSize(10, topMargin); // Add some space below the groupbox
        }
        break;
    case CT_RadioButton:
    case CT_CheckBox:
        newSize += QSize(0, 1);
        break;
    case CT_ToolButton:
        newSize += QSize(2, 2);
        break;
    case CT_SpinBox:
        newSize += QSize(0, -3);
        break;
    case CT_ComboBox:
        newSize += QSize(2, 4);
        break;
    case CT_LineEdit:
        newSize += QSize(0, 4);
        break;
    case CT_MenuBarItem:
        newSize += QSize(8, 5);
        break;
    case CT_MenuItem:
        if (const QStyleOptionMenuItem *menuItem = qstyleoption_cast<const QStyleOptionMenuItem *>(option)) {
            int w = size.width(); // Don't rely of QCommonStyle's width calculation here
            if (menuItem->text.contains(u'\t'))
                w += menuItem->reservedShortcutWidth;
            else if (menuItem->menuItemType == QStyleOptionMenuItem::SubMenu)
                w += 2 * QStyleHelper::dpiScaled(QFusionStylePrivate::menuArrowHMargin, option);
            else if (menuItem->menuItemType == QStyleOptionMenuItem::DefaultItem) {
                const QFontMetricsF fm(menuItem->font);
                QFont fontBold = menuItem->font;
                fontBold.setBold(true);
                const QFontMetricsF fmBold(fontBold);
                w += qCeil(fmBold.horizontalAdvance(menuItem->text) - fm.horizontalAdvance(menuItem->text));
            }
            const qreal dpi = QStyleHelper::dpi(option);
             // Windows always shows a check column
            const int checkcol = qMax<int>(menuItem->maxIconWidth,
                                           QStyleHelper::dpiScaled(QFusionStylePrivate::menuCheckMarkWidth, dpi));
            w += checkcol + windowsItemFrame;
            w += QStyleHelper::dpiScaled(int(QFusionStylePrivate::menuRightBorder) + 10, dpi);
            newSize.setWidth(w);
            if (menuItem->menuItemType == QStyleOptionMenuItem::Separator) {
                if (!menuItem->text.isEmpty()) {
                    newSize.setHeight(menuItem->fontMetrics.height());
                }
            }
            else if (!menuItem->icon.isNull()) {
#if QT_CONFIG(combobox)
                if (const QComboBox *combo = qobject_cast<const QComboBox*>(widget)) {
                    newSize.setHeight(qMax(combo->iconSize().height() + 2, newSize.height()));
                }
#endif
            }
            newSize.setWidth(newSize.width() + int(QStyleHelper::dpiScaled(12, dpi)));
            newSize.setWidth(qMax<int>(newSize.width(), int(QStyleHelper::dpiScaled(120, dpi))));
        }
        break;
    case CT_SizeGrip:
        newSize += QSize(4, 4);
        break;
    case CT_MdiControls:
        newSize -= QSize(1, 0);
        break;
    default:
        break;
    }
    return newSize;
}